

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_fp16s(InnerProduct_x86_avx *this,Option *opt)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  byte *in_RSI;
  Mat *in_RDI;
  int num_input;
  Option *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 *puVar5;
  undefined4 in_stack_ffffffffffffffd0;
  
  innerproduct_transform_kernel_fp16s_sse
            ((Mat *)CONCAT44(*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             / *(int *)((long)&in_RDI[2].cstep +
                                       *(long *)((long)in_RDI->data + -0x18)),
                             in_stack_ffffffffffffffd0),in_RDI,
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  if ((*in_RSI & 1) != 0) {
    lVar2 = *(long *)((long)in_RDI->data + -0x18);
    puVar5 = (undefined8 *)((long)&in_RDI[4].elemsize + lVar2);
    if (*(long *)((long)&in_RDI[4].elempack + lVar2) != 0) {
      piVar3 = *(int **)((long)&in_RDI[4].elempack + lVar2);
      LOCK();
      iVar1 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)((long)&in_RDI[4].h + lVar2) == 0) {
          if ((void *)*puVar5 != (void *)0x0) {
            free((void *)*puVar5);
          }
        }
        else {
          plVar4 = *(long **)((long)&in_RDI[4].h + lVar2);
          (**(code **)(*plVar4 + 0x18))(plVar4,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)(puVar5 + 5) = 0;
    *(undefined4 *)((long)puVar5 + 0x2c) = 0;
    *(undefined4 *)(puVar5 + 6) = 0;
    *(undefined4 *)((long)puVar5 + 0x34) = 0;
    *(undefined4 *)(puVar5 + 7) = 0;
    puVar5[8] = 0;
    puVar5[1] = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}